

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.cpp
# Opt level: O3

void assertion_fail(string_view file,int line,string_view func,string_view assertion)

{
  string str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> local_4c;
  char local_38 [16];
  string local_28;
  
  tinyformat::
  format<std::basic_string_view<char,std::char_traits<char>>,int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (&local_28,(tinyformat *)"%s:%s %s: Assertion `%s\' failed.\n",local_38,&local_4c,
             (int *)((long)&local_4c._M_len + 4),
             (basic_string_view<char,_std::char_traits<char>_> *)&stack0x00000008,
             in_stack_ffffffffffffffa8);
  fwrite(local_28._M_dataplus._M_p,1,local_28._M_string_length,_stderr);
  abort();
}

Assistant:

void assertion_fail(std::string_view file, int line, std::string_view func, std::string_view assertion)
{
    auto str = strprintf("%s:%s %s: Assertion `%s' failed.\n", file, line, func, assertion);
    fwrite(str.data(), 1, str.size(), stderr);
    std::abort();
}